

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lopcodes.c
# Opt level: O2

char * raviP_instruction_to_str(char *buf,size_t n,Instruction i)

{
  size_t sVar1;
  char *__format;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  
  uVar6 = i >> 0x10;
  uVar2 = i >> 8 & 0x7f;
  snprintf(buf,n,"%s ",luaP_opnames[i & 0xff]);
  bVar5 = luaP_opmodes[i & 0xff];
  switch(bVar5 & 3) {
  case 0:
    sVar1 = strlen(buf);
    snprintf(buf + sVar1,n - sVar1,"A=%d",(ulong)uVar2);
    bVar3 = bVar5 >> 4 & 3;
    if (bVar3 != 0) {
      uVar4 = i >> 0x18;
      sVar1 = strlen(buf);
      uVar2 = ~uVar4 | 0xffffff80;
      if (bVar3 != 3) {
        uVar2 = uVar4;
      }
      if (-1 < (int)i) {
        uVar2 = uVar4;
      }
      snprintf(buf + sVar1,n - sVar1," B=%d",(ulong)uVar2);
    }
    bVar5 = bVar5 >> 2 & 3;
    if (bVar5 == 0) {
      return buf;
    }
    sVar1 = strlen(buf);
    __format = " C=%d";
    uVar2 = ~uVar6 | 0xffffff80;
    if (bVar5 != 3) {
      uVar2 = uVar6 & 0xff;
    }
    if ((i >> 0x17 & 1) == 0) {
      uVar2 = uVar6 & 0xff;
    }
    break;
  case 1:
    sVar1 = strlen(buf);
    snprintf(buf + sVar1,n - sVar1,"A=%d",(ulong)uVar2);
    if ((bVar5 & 0x30) == 0x10) {
      sVar1 = strlen(buf);
    }
    else {
      if ((bVar5 & 0x30) != 0x30) {
        return buf;
      }
      sVar1 = strlen(buf);
      uVar6 = ~uVar6;
    }
    __format = " Bx=%d";
    uVar2 = uVar6;
    break;
  case 2:
    sVar1 = strlen(buf);
    snprintf(buf + sVar1,n - sVar1,"As=%d Bx=%d",(ulong)uVar2,(ulong)(uVar6 - 0x8000));
    return buf;
  case 3:
    sVar1 = strlen(buf);
    __format = "Ax=%d";
    uVar2 = ~(i >> 8);
  }
  snprintf(buf + sVar1,n - sVar1,__format,(ulong)uVar2);
  return buf;
}

Assistant:

const char* raviP_instruction_to_str(char *buf, size_t n, Instruction i) {
  OpCode o = GET_OPCODE(i);
  int a = GETARG_A(i);
  int b = GETARG_B(i);
  int c = GETARG_C(i);
  int ax = GETARG_Ax(i);
  int bx = GETARG_Bx(i);
  int sbx = GETARG_sBx(i);
  snprintf(buf, n, "%s ", luaP_opnames[o]);
  switch (getOpMode(o)) {
  case iABC:
    snprintf(buf+strlen(buf), n-strlen(buf), "A=%d", a);
    if (getBMode(o) != OpArgN)
      snprintf(buf + strlen(buf), n - strlen(buf), " B=%d", (getBMode(o) == OpArgK && ISK(b)) ? (MYK(INDEXK(b))) : b);
    if (getCMode(o) != OpArgN)
      snprintf(buf + strlen(buf), n - strlen(buf), " C=%d", (getCMode(o) == OpArgK && ISK(c)) ? (MYK(INDEXK(c))) : c);
    break;
  case iABx:
    snprintf(buf + strlen(buf), n - strlen(buf), "A=%d", a);
    if (getBMode(o) == OpArgK)
      snprintf(buf + strlen(buf), n - strlen(buf), " Bx=%d", MYK(bx));
    if (getBMode(o) == OpArgU)
      snprintf(buf + strlen(buf), n - strlen(buf), " Bx=%d", bx);
    break;
  case iAsBx:
    snprintf(buf + strlen(buf), n - strlen(buf), "As=%d Bx=%d", a, sbx);
    break;
  case iAx:
    snprintf(buf + strlen(buf), n - strlen(buf), "Ax=%d", MYK(ax));
    break;
  }
  return buf;
}